

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall CProficiencies::DisplayProfsForStat(CProficiencies *this,CHAR_DATA *imm)

{
  uint uVar1;
  const_reference pvVar2;
  CHAR_DATA *in_RDI;
  char *fbuf;
  int i;
  char buf2 [4608];
  char buf [4608];
  char *in_stack_ffffffffffffdbc0;
  char *__s;
  int local_241c;
  char *in_stack_ffffffffffffdbe8;
  char local_1218 [4600];
  char *in_stack_ffffffffffffffe0;
  
  __s = local_1218;
  uVar1 = GetPoints((CProficiencies *)in_RDI);
  sprintf(__s,"Proficiencies (%d pts left): ",(ulong)uVar1);
  local_241c = 0;
  while (pvVar2 = std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                            (&prof_table,(long)local_241c), pvVar2->name != (char *)0x0) {
    if (*(int *)((long)&in_RDI->master + (long)local_241c * 4 + 4) != -1) {
      in_stack_ffffffffffffdbc0 = &stack0xffffffffffffdbe8;
      pvVar2 = std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                         (&prof_table,(long)local_241c);
      sprintf(in_stack_ffffffffffffdbc0,"%s (%d) ",pvVar2->name,
              (ulong)*(uint *)((long)&in_RDI->master + (long)local_241c * 4 + 4));
      strcat(local_1218,&stack0xffffffffffffdbe8);
    }
    local_241c = local_241c + 1;
  }
  palloc_string(in_stack_ffffffffffffdbe8);
  format_string(in_stack_ffffffffffffffe0);
  send_to_char(__s,in_RDI);
  free_pstring(in_stack_ffffffffffffdbc0);
  return;
}

Assistant:

void CProficiencies::DisplayProfsForStat(CHAR_DATA *imm)
{
	// auto points = GetPoints();
	// auto buffer = fmt::format("Proficiencies ({} pts left): \n\r", points);

	// auto prof_table_size = std::size(prof_table);
	// for (auto i = 0; i < prof_table_size; i++)
	// {
	// 	if (profs[i] == -1)
	// 		continue;

	// 	buffer += fmt::format("{} ({}) \n\r", prof_table[i].name, profs[i]);
	// }

	// buffer = std::string(format_string(buffer.data()));
	// send_to_char(buffer.c_str(), imm);

	// TODO: the above code causes a double free error, so using the old code for now
	// boo format_string(char*) boo!!!

	char buf[MSL], buf2[MSL];
	int i;
	sprintf(buf, "Proficiencies (%d pts left): ", GetPoints());
	for(i = 0; prof_table[i].name != nullptr; i++)
	{
		if(profs[i] == -1)
			continue;
		sprintf(buf2,"%s (%d) ", prof_table[i].name, profs[i]);
		strcat(buf, buf2);
	}
	char *fbuf = palloc_string(buf);
	fbuf = format_string(fbuf);
	send_to_char(fbuf, imm);
	free_pstring(fbuf);
}